

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::define_data(PeleLM *this)

{
  bool bVar1;
  StateDescriptor *this_00;
  pointer pFVar2;
  MultiFab **ppMVar3;
  FabFactory<amrex::FArrayBox> *val;
  AmrLevel *this_01;
  long in_RDI;
  int nGrowS;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *kv;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  int nEdgeStates;
  int nGrowEdges;
  int nGrow;
  AmrLevel *in_stack_fffffffffffffe08;
  BoxArray *bxs;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  MFInfo *in_stack_fffffffffffffe30;
  Geometry *geom;
  mapped_type *in_stack_fffffffffffffe38;
  MFInfo *in_stack_fffffffffffffe40;
  BoxArray *in_stack_fffffffffffffe48;
  MFInfo *in_stack_fffffffffffffe50;
  BoxArray *in_stack_fffffffffffffe58;
  MultiFab *in_stack_fffffffffffffe60;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffe70;
  bool local_105;
  int local_104 [4];
  int local_f4 [2];
  uint local_ec;
  undefined1 local_e8 [64];
  FabFactory<amrex::FArrayBox> local_a8;
  Real RStack_a0;
  undefined8 local_98;
  Real RStack_90;
  Real local_88;
  reference local_70;
  _Self local_68;
  _Self local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_58;
  int local_14;
  uint local_10;
  undefined4 local_c;
  
  local_c = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  local_105 = true;
  if (!bVar1) {
    local_105 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  }
  local_10 = local_105 | 2;
  this_00 = amrex::DescriptorList::operator[]
                      ((DescriptorList *)in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  local_14 = amrex::StateDescriptor::nComp(this_00);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  operator_new(8);
  FluxBoxes::FluxBoxes((FluxBoxes *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0,0x28bf67);
  std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>::
  unique_ptr<std::default_delete<FluxBoxes>,void>
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10,
             (pointer)in_stack_fffffffffffffe08);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::push_back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
               *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          *)in_stack_fffffffffffffe10);
  pFVar2 = std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::operator->
                     ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)0x28bfce);
  ppMVar3 = FluxBoxes::get(pFVar2);
  *(MultiFab ***)(in_RDI + 0x18e0) = ppMVar3;
  operator_new(8);
  FluxBoxes::FluxBoxes((FluxBoxes *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0,0x28c01b);
  std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>::
  unique_ptr<std::default_delete<FluxBoxes>,void>
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10,
             (pointer)in_stack_fffffffffffffe08);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::push_back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
               *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          *)in_stack_fffffffffffffe10);
  pFVar2 = std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::operator->
                     ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)0x28c082);
  ppMVar3 = FluxBoxes::get(pFVar2);
  *(MultiFab ***)(in_RDI + 0x18e8) = ppMVar3;
  operator_new(8);
  FluxBoxes::FluxBoxes((FluxBoxes *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0,0x28c0c8);
  std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>::
  unique_ptr<std::default_delete<FluxBoxes>,void>
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10,
             (pointer)in_stack_fffffffffffffe08);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::push_back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
               *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          *)in_stack_fffffffffffffe10);
  pFVar2 = std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::operator->
                     ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)0x28c12f);
  ppMVar3 = FluxBoxes::get(pFVar2);
  *(MultiFab ***)(in_RDI + 0x18f0) = ppMVar3;
  operator_new(8);
  FluxBoxes::FluxBoxes((FluxBoxes *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0,0x28c175);
  std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>::
  unique_ptr<std::default_delete<FluxBoxes>,void>
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10,
             (pointer)in_stack_fffffffffffffe08);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::push_back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
               *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10);
  std::
  vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ::back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          *)in_stack_fffffffffffffe10);
  pFVar2 = std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::operator->
                     ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)0x28c1d4);
  ppMVar3 = FluxBoxes::get(pFVar2);
  *(MultiFab ***)(in_RDI + 0x18f8) = ppMVar3;
  if (use_wbar != 0) {
    operator_new(8);
    FluxBoxes::FluxBoxes
              ((FluxBoxes *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0,0x28c23a);
    std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>::
    unique_ptr<std::default_delete<FluxBoxes>,void>
              ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10,
               (pointer)in_stack_fffffffffffffe08);
    std::
    vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
    ::push_back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
                 *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
    std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
              ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)in_stack_fffffffffffffe10);
    std::
    vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
    ::back((vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
            *)in_stack_fffffffffffffe10);
    pFVar2 = std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::operator->
                       ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)0x28c290);
    ppMVar3 = FluxBoxes::get(pFVar2);
    *(MultiFab ***)(in_RDI + 0x1900) = ppMVar3;
  }
  local_58 = &auxDiag_names_abi_cxx11_;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    local_70 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)0x28c4a6);
    in_stack_fffffffffffffe40 = (MFInfo *)operator_new(0x180);
    local_e8[0x37] = 1;
    in_stack_fffffffffffffe58 = (BoxArray *)(in_RDI + 0xd8);
    in_stack_fffffffffffffe60 = (MultiFab *)(in_RDI + 0x140);
    in_stack_fffffffffffffe50 = in_stack_fffffffffffffe40;
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x28c500);
    local_98._0_1_ = false;
    local_98._1_7_ = 0;
    RStack_90 = 0.0;
    local_a8._vptr_FabFactory = (_func_int **)0x0;
    RStack_a0 = 0.0;
    local_88 = 0.0;
    in_stack_fffffffffffffe70 = &local_a8;
    amrex::MFInfo::MFInfo((MFInfo *)0x28c535);
    local_e8._56_8_ = 0.0;
    bxs = (BoxArray *)(local_e8 + 0x38);
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe48 = bxs;
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffffe50,bxs,
               (DistributionMapping *)in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffe60);
    local_e8[0x37] = 0;
    std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
    unique_ptr<std::default_delete<amrex::MultiFab>,void>
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffe10,(pointer)bxs);
    in_stack_fffffffffffffe38 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                       *)in_stack_fffffffffffffe50,(key_type *)in_stack_fffffffffffffe48);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)bxs);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffe10);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x28c5e9);
    amrex::MFInfo::~MFInfo((MFInfo *)0x28c5f6);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                  *)in_stack_fffffffffffffe50,(key_type *)in_stack_fffffffffffffe48);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x28c61a);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffe10,(value_type)bxs);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe10);
  }
  local_e8._48_4_ = nGrowAdvForcing;
  this_01 = (AmrLevel *)(in_RDI + 0x1748);
  local_e8._16_8_ = 0.0;
  local_e8._24_8_ = 0.0;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = 0.0;
  local_e8._32_8_ = 0.0;
  geom = (Geometry *)local_e8;
  amrex::MFInfo::MFInfo((MFInfo *)0x28c72f);
  val = amrex::AmrLevel::Factory(this_01);
  amrex::MultiFab::define
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (DistributionMapping *)in_stack_fffffffffffffe50,
             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe70);
  amrex::MFInfo::~MFInfo((MFInfo *)0x28c776);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)this_01,(value_type)val);
  if (*(int *)(in_RDI + 8) == 0) {
    getStrip(geom);
    stripBox.smallend.vect._0_8_ = local_104._0_8_;
    stripBox._8_8_ = local_104._8_8_;
    stripBox.bigend.vect._4_8_ = local_f4;
    stripBox.btype.itype = local_ec;
  }
  return;
}

Assistant:

void
PeleLM::define_data ()
{
   const int nGrow       = 0;
#ifdef AMREX_USE_EB
   // Only the advection piece uses this, so set based on hydro. redistribution_type
   const int nGrowEdges  = (redistribution_type == "StateRedist"||
                            redistribution_type == "NewStateRedist") ? 3 : 2;
#else
   const int nGrowEdges  = 0;
#endif
   const int nEdgeStates = desc_lst[State_Type].nComp();

   mTmpData.resize(mHtoTiterMAX);

   raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, nEdgeStates, nGrowEdges)});
   EdgeState = raii_fbs.back()->get();

   raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, nEdgeStates, nGrowEdges)});
   EdgeFlux  = raii_fbs.back()->get();

   if (NUM_SPECIES>0)
   {
     raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES+3, nGrow)});
     SpecDiffusionFluxn   = raii_fbs.back()->get();

     raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES+3, nGrow)});
     SpecDiffusionFluxnp1 = raii_fbs.back()->get();

#ifndef NDEBUG
     for ( int i = 0; i<AMREX_SPACEDIM; i++) {
       SpecDiffusionFluxnp1[i]->setVal(1.2345e40);
       SpecDiffusionFluxn[i]->setVal(1.2345e40);
     }
#endif

     if (use_wbar) {
        raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES, nGrow)});
        SpecDiffusionFluxWbar = raii_fbs.back()->get();
     }
   }

   for (const auto& kv : auxDiag_names)
   {
      auxDiag[kv.first] = std::unique_ptr<MultiFab>(new MultiFab(grids,dmap,kv.second.size(),0));
      auxDiag[kv.first]->setVal(0.0);
   }
   const int nGrowS = nGrowAdvForcing; // TODO: Ensure this is enough
   external_sources.define(grids, dmap, NUM_STATE, nGrowS, amrex::MFInfo(), Factory());
   external_sources.setVal(0.);
   // HACK for debugging
   if (level==0)
      stripBox = getStrip(geom);
}